

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t set_fflags_platform(archive_write_disk *a,wchar_t fd,char *name,mode_t mode,
                           unsigned_long set,unsigned_long clear)

{
  archive_write_disk *a_00;
  int iVar1;
  int *piVar2;
  uint local_50;
  wchar_t sf_mask;
  wchar_t oldflags;
  wchar_t newflags;
  wchar_t myfd;
  wchar_t ret;
  unsigned_long clear_local;
  unsigned_long set_local;
  char *pcStack_28;
  mode_t mode_local;
  char *name_local;
  archive_write_disk *paStack_18;
  wchar_t fd_local;
  archive_write_disk *a_local;
  
  if ((set == 0) && (clear == 0)) {
    return L'\0';
  }
  if (((mode & 0xf000) != 0x8000) && ((mode & 0xf000) != 0x4000)) {
    return L'\0';
  }
  oldflags = fd;
  _myfd = clear;
  clear_local = set;
  set_local._4_4_ = mode;
  pcStack_28 = name;
  name_local._4_4_ = fd;
  paStack_18 = a;
  if (fd < L'\0') {
    oldflags = open(name,0xa0800);
    __archive_ensure_cloexec_flag(oldflags);
  }
  if (oldflags < L'\0') {
    return L'\0';
  }
  newflags = L'\0';
  iVar1 = ioctl(oldflags,0x80086601,&local_50);
  if (-1 < iVar1) {
    sf_mask = local_50 & ((uint)_myfd ^ 0xffffffff) | (uint)clear_local;
    iVar1 = ioctl(oldflags,0x40086602,&sf_mask);
    if (-1 < iVar1) goto LAB_0016ea12;
    piVar2 = __errno_location();
    if (*piVar2 == 1) {
      local_50 = local_50 & 0x4030;
      sf_mask = local_50 | sf_mask & 0xffffbfcfU;
      iVar1 = ioctl(oldflags,0x40086602,&sf_mask);
      if (-1 < iVar1) goto LAB_0016ea12;
    }
  }
  a_00 = paStack_18;
  piVar2 = __errno_location();
  archive_set_error(&a_00->archive,*piVar2,"Failed to set file flags");
  newflags = L'\xffffffec';
LAB_0016ea12:
  if (name_local._4_4_ < L'\0') {
    close(oldflags);
  }
  return newflags;
}

Assistant:

static int
set_fflags_platform(struct archive_write_disk *a, int fd, const char *name,
    mode_t mode, unsigned long set, unsigned long clear)
{
	int		 ret;
	int		 myfd = fd;
	int newflags, oldflags;
	/*
	 * Linux has no define for the flags that are only settable by
	 * the root user.  This code may seem a little complex, but
	 * there seem to be some Linux systems that lack these
	 * defines. (?)  The code below degrades reasonably gracefully
	 * if sf_mask is incomplete.
	 */
	const int sf_mask = 0
#if defined(FS_IMMUTABLE_FL)
	    | FS_IMMUTABLE_FL
#elif defined(EXT2_IMMUTABLE_FL)
	    | EXT2_IMMUTABLE_FL
#endif
#if defined(FS_APPEND_FL)
	    | FS_APPEND_FL
#elif defined(EXT2_APPEND_FL)
	    | EXT2_APPEND_FL
#endif
#if defined(FS_JOURNAL_DATA_FL)
	    | FS_JOURNAL_DATA_FL
#endif
	;

	if (set == 0 && clear == 0)
		return (ARCHIVE_OK);
	/* Only regular files and dirs can have flags. */
	if (!S_ISREG(mode) && !S_ISDIR(mode))
		return (ARCHIVE_OK);

	/* If we weren't given an fd, open it ourselves. */
	if (myfd < 0) {
		myfd = open(name, O_RDONLY | O_NONBLOCK | O_BINARY |
		    O_CLOEXEC | O_NOFOLLOW);
		__archive_ensure_cloexec_flag(myfd);
	}
	if (myfd < 0)
		return (ARCHIVE_OK);

	/*
	 * XXX As above, this would be way simpler if we didn't have
	 * to read the current flags from disk. XXX
	 */
	ret = ARCHIVE_OK;

	/* Read the current file flags. */
	if (ioctl(myfd,
#ifdef FS_IOC_GETFLAGS
	    FS_IOC_GETFLAGS,
#else
	    EXT2_IOC_GETFLAGS,
#endif
	    &oldflags) < 0)
		goto fail;

	/* Try setting the flags as given. */
	newflags = (oldflags & ~clear) | set;
	if (ioctl(myfd,
#ifdef FS_IOC_SETFLAGS
	    FS_IOC_SETFLAGS,
#else
	    EXT2_IOC_SETFLAGS,
#endif
	    &newflags) >= 0)
		goto cleanup;
	if (errno != EPERM)
		goto fail;

	/* If we couldn't set all the flags, try again with a subset. */
	newflags &= ~sf_mask;
	oldflags &= sf_mask;
	newflags |= oldflags;
	if (ioctl(myfd,
#ifdef FS_IOC_SETFLAGS
	    FS_IOC_SETFLAGS,
#else
	    EXT2_IOC_SETFLAGS,
#endif
	    &newflags) >= 0)
		goto cleanup;

	/* We couldn't set the flags, so report the failure. */
fail:
	archive_set_error(&a->archive, errno,
	    "Failed to set file flags");
	ret = ARCHIVE_WARN;
cleanup:
	if (fd < 0)
		close(myfd);
	return (ret);
}